

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileData.h
# Opt level: O0

void __thiscall Assimp::ObjFile::Material::Material(Material *this)

{
  aiString *local_20;
  ulong local_18;
  size_t i;
  Material *this_local;
  
  aiString::aiString(&this->MaterialName);
  aiString::aiString(&this->texture);
  aiString::aiString(&this->textureSpecular);
  aiString::aiString(&this->textureAmbient);
  aiString::aiString(&this->textureEmissive);
  aiString::aiString(&this->textureBump);
  aiString::aiString(&this->textureNormal);
  local_20 = this->textureReflection;
  do {
    aiString::aiString(local_20);
    local_20 = local_20 + 1;
  } while (local_20 != &this->textureSpecularity);
  aiString::aiString(&this->textureSpecularity);
  aiString::aiString(&this->textureOpacity);
  aiString::aiString(&this->textureDisp);
  aiColor3D::aiColor3D(&this->ambient);
  aiColor3D::aiColor3D(&this->diffuse,0.6,0.6,0.6);
  aiColor3D::aiColor3D(&this->specular);
  aiColor3D::aiColor3D(&this->emissive);
  this->alpha = 1.0;
  this->shineness = 0.0;
  this->illumination_model = 1;
  this->ior = 1.0;
  aiColor3D::aiColor3D(&this->transparent,1.0,1.0,1.0);
  for (local_18 = 0; local_18 < 0x10; local_18 = local_18 + 1) {
    this->clamp[local_18] = false;
  }
  return;
}

Assistant:

Material()
    :   diffuse ( ai_real( 0.6 ), ai_real( 0.6 ), ai_real( 0.6 ) )
    ,   alpha   (ai_real( 1.0 ) )
    ,   shineness ( ai_real( 0.0) )
    ,   illumination_model (1)
    ,   ior     ( ai_real( 1.0 ) )
    ,   transparent( ai_real( 1.0), ai_real (1.0), ai_real(1.0)) {
        // empty
        for (size_t i = 0; i < TextureTypeCount; ++i) {
            clamp[ i ] = false;
        }
    }